

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_sqrt_d_mips64el(CPUMIPSState_conflict10 *env,uint64_t fdt0)

{
  float64 fVar1;
  uintptr_t unaff_retaddr;
  uint64_t fdt0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = float64_sqrt_mips64el(fdt0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint64_t helper_float_sqrt_d(CPUMIPSState *env, uint64_t fdt0)
{
    fdt0 = float64_sqrt(fdt0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fdt0;
}